

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O1

void __thiscall SummedArea_Constant_Test::TestBody(SummedArea_Constant_Test *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  Allocator alloc;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  char *pcVar10;
  int iVar11;
  undefined1 auVar12 [16];
  AssertionResult gtest_ar;
  SummedAreaTable sat;
  AssertHelper local_78;
  Bounds2f local_70;
  internal local_60 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  Float local_4c;
  Array2D<float> local_48;
  Array2D<double> local_28;
  
  local_48.allocator.memoryResource = pstd::pmr::new_delete_resource();
  local_48.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x = 0;
  local_48.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y = 0;
  local_48.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x = 4;
  local_48.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y = 4;
  iVar6 = (*(local_48.allocator.memoryResource)->_vptr_memory_resource[2])
                    (local_48.allocator.memoryResource,0x40,4);
  local_48.values = (float *)CONCAT44(extraout_var,iVar6);
  local_48.values[0] = 0.0;
  local_48.values[1] = 0.0;
  local_48.values[2] = 0.0;
  local_48.values[3] = 0.0;
  local_48.values[4] = 0.0;
  local_48.values[5] = 0.0;
  local_48.values[6] = 0.0;
  local_48.values[7] = 0.0;
  local_48.values[8] = 0.0;
  local_48.values[9] = 0.0;
  local_48.values[10] = 0.0;
  local_48.values[0xb] = 0.0;
  local_48.values[0xc] = 0.0;
  local_48.values[0xd] = 0.0;
  local_48.values[0xe] = 0.0;
  local_48.values[0xf] = 0.0;
  if (local_48.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y <
      local_48.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y) {
    uVar7 = local_48.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
            local_48.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
    iVar6 = -(local_48.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y * uVar7 +
             local_48.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x);
    iVar8 = 0;
    do {
      uVar9 = (ulong)uVar7;
      iVar11 = iVar6;
      if (0 < (int)uVar7) {
        do {
          local_48.values[iVar11] = 1.0;
          iVar11 = iVar11 + 1;
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
      }
      iVar8 = iVar8 + 1;
      iVar6 = iVar6 + uVar7;
    } while (iVar8 != local_48.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y -
                      local_48.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y);
  }
  alloc.memoryResource = pstd::pmr::new_delete_resource();
  pbrt::SummedAreaTable::SummedAreaTable((SummedAreaTable *)&local_28,&local_48,alloc);
  local_78.data_._0_4_ = 1;
  auVar12._8_4_ = 0x3f800000;
  auVar12._0_8_ = 0x3f8000003f800000;
  auVar12._12_4_ = 0x3f800000;
  local_70 = (Bounds2f)vmovlhps_avx(ZEXT816(0) << 0x40,auVar12);
  local_4c = pbrt::SummedAreaTable::Integral((SummedAreaTable *)&local_28,&local_70);
  testing::internal::CmpHelperEQ<int,float>
            (local_60,"1","sat.Integral(Bounds2f(Point2f(0, 0), Point2f(1, 1)))",(int *)&local_78,
             &local_4c);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
               ,0x4e2,pcVar10);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_70.pMin.super_Tuple2<pbrt::Point2,_float> != (Tuple2<pbrt::Point2,_float>)0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) &&
         (local_70.pMin.super_Tuple2<pbrt::Point2,_float> != (Tuple2<pbrt::Point2,_float>)0x0)) {
        (**(code **)(*(long *)local_70.pMin.super_Tuple2<pbrt::Point2,_float> + 8))();
      }
      auVar1._8_8_ = 0;
      auVar1._0_4_ = local_70.pMax.super_Tuple2<pbrt::Point2,_float>.x;
      auVar1._4_4_ = local_70.pMax.super_Tuple2<pbrt::Point2,_float>.y;
      local_70 = (Bounds2f)(auVar1 << 0x40);
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_78.data_ = (AssertHelperData *)&DAT_3fe0000000000000;
  local_70 = (Bounds2f)vmovhps_avx(ZEXT816(0) << 0x40,0x3f0000003f800000);
  local_4c = pbrt::SummedAreaTable::Integral((SummedAreaTable *)&local_28,&local_70);
  testing::internal::CmpHelperEQ<double,float>
            (local_60,"0.5","sat.Integral(Bounds2f(Point2f(0, 0), Point2f(1, 0.5)))",
             (double *)&local_78,&local_4c);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
               ,0x4e3,pcVar10);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_70.pMin.super_Tuple2<pbrt::Point2,_float> != (Tuple2<pbrt::Point2,_float>)0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) &&
         (local_70.pMin.super_Tuple2<pbrt::Point2,_float> != (Tuple2<pbrt::Point2,_float>)0x0)) {
        (**(code **)(*(long *)local_70.pMin.super_Tuple2<pbrt::Point2,_float> + 8))();
      }
      auVar2._8_8_ = 0;
      auVar2._0_4_ = local_70.pMax.super_Tuple2<pbrt::Point2,_float>.x;
      auVar2._4_4_ = local_70.pMax.super_Tuple2<pbrt::Point2,_float>.y;
      local_70 = (Bounds2f)(auVar2 << 0x40);
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_78.data_ = (AssertHelperData *)&DAT_3fe0000000000000;
  local_70 = (Bounds2f)vmovhps_avx(ZEXT816(0) << 0x40,0x3f8000003f000000);
  local_4c = pbrt::SummedAreaTable::Integral((SummedAreaTable *)&local_28,&local_70);
  testing::internal::CmpHelperEQ<double,float>
            (local_60,"0.5","sat.Integral(Bounds2f(Point2f(0, 0), Point2f(0.5, 1)))",
             (double *)&local_78,&local_4c);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
               ,0x4e4,pcVar10);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_70.pMin.super_Tuple2<pbrt::Point2,_float> != (Tuple2<pbrt::Point2,_float>)0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) &&
         (local_70.pMin.super_Tuple2<pbrt::Point2,_float> != (Tuple2<pbrt::Point2,_float>)0x0)) {
        (**(code **)(*(long *)local_70.pMin.super_Tuple2<pbrt::Point2,_float> + 8))();
      }
      auVar3._8_8_ = 0;
      auVar3._0_4_ = local_70.pMax.super_Tuple2<pbrt::Point2,_float>.x;
      auVar3._4_4_ = local_70.pMax.super_Tuple2<pbrt::Point2,_float>.y;
      local_70 = (Bounds2f)(auVar3 << 0x40);
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_78.data_ = (AssertHelperData *)0x3fc8000000000000;
  local_70 = (Bounds2f)vmovhps_avx(ZEXT816(0) << 0x40,0x3f4000003e800000);
  local_4c = pbrt::SummedAreaTable::Integral((SummedAreaTable *)&local_28,&local_70);
  testing::internal::CmpHelperEQ<double,float>
            (local_60,"3. / 16.","sat.Integral(Bounds2f(Point2f(0, 0), Point2f(.25, .75)))",
             (double *)&local_78,&local_4c);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
               ,0x4e5,pcVar10);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_70.pMin.super_Tuple2<pbrt::Point2,_float> != (Tuple2<pbrt::Point2,_float>)0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) &&
         (local_70.pMin.super_Tuple2<pbrt::Point2,_float> != (Tuple2<pbrt::Point2,_float>)0x0)) {
        (**(code **)(*(long *)local_70.pMin.super_Tuple2<pbrt::Point2,_float> + 8))();
      }
      auVar4._8_8_ = 0;
      auVar4._0_4_ = local_70.pMax.super_Tuple2<pbrt::Point2,_float>.x;
      auVar4._4_4_ = local_70.pMax.super_Tuple2<pbrt::Point2,_float>.y;
      local_70 = (Bounds2f)(auVar4 << 0x40);
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_78.data_ = (AssertHelperData *)0x3fc8000000000000;
  local_70.pMin.super_Tuple2<pbrt::Point2,_float>.x = 0.5;
  local_70.pMin.super_Tuple2<pbrt::Point2,_float>.y = 0.25;
  local_70.pMax.super_Tuple2<pbrt::Point2,_float>.x = 0.75;
  local_70.pMax.super_Tuple2<pbrt::Point2,_float>.y = 1.0;
  local_4c = pbrt::SummedAreaTable::Integral((SummedAreaTable *)&local_28,&local_70);
  testing::internal::CmpHelperEQ<double,float>
            (local_60,"3. / 16.","sat.Integral(Bounds2f(Point2f(0.5, 0.25), Point2f(0.75, 1)))",
             (double *)&local_78,&local_4c);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
               ,0x4e6,pcVar10);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_70.pMin.super_Tuple2<pbrt::Point2,_float> != (Tuple2<pbrt::Point2,_float>)0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) &&
         (local_70.pMin.super_Tuple2<pbrt::Point2,_float> != (Tuple2<pbrt::Point2,_float>)0x0)) {
        (**(code **)(*(long *)local_70.pMin.super_Tuple2<pbrt::Point2,_float> + 8))();
      }
      local_70.pMin.super_Tuple2<pbrt::Point2,_float>.x = 0.0;
      local_70.pMin.super_Tuple2<pbrt::Point2,_float>.y = 0.0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pbrt::Array2D<double>::~Array2D(&local_28);
  pbrt::Array2D<float>::~Array2D(&local_48);
  return;
}

Assistant:

TEST(Sampling, SmoothStep) {
    Float start = SampleSmoothStep(0, 10, 20);
    // Fairly high slop since lots of values close to the start are close
    // to zero.
    EXPECT_LT(std::abs(start - 10), .1) << start;

    Float end = SampleSmoothStep(1, -10, -5);
    EXPECT_LT(std::abs(end - -5), 1e-5) << end;

    Float mid = SampleSmoothStep(0.5, 0, 1);
    // Solved this numericalla in Mathematica.
    EXPECT_LT(std::abs(mid - 0.733615), 1e-5) << mid;

    for (Float u : Uniform1D(1000)) {
        Float x = SampleSmoothStep(u, -3, 5);
        Float ratio = SmoothStep(x, -3, 5) / SmoothStepPDF(x, -3, 5);
        // SmoothStep over [-3,5] integrates to 4.
        EXPECT_LT(std::abs(ratio - 4), 1e-5) << ratio;

        auto checkErr = [](Float a, Float b) {
            Float err;
            if (std::min(std::abs(a), std::abs(b)) < 1e-2)
                err = std::abs(a - b);
            else
                err = std::abs(2 * (a - b) / (a + b));
            return err > 1e-2;
        };
        EXPECT_FALSE(checkErr(u, InvertSmoothStepSample(x, -3, 5)));
    }

    auto ss = [](Float v) { return SmoothStep(v, 0, 1); };
    auto values = Sample1DFunction(ss, 1024, 64 * 1024, 0.f, 1.f);
    PiecewiseConstant1D distrib(values);
    for (Float u : Uniform1D(100, 62351)) {
        Float cx = SampleSmoothStep(u, 0, 1);
        Float cp = SmoothStepPDF(cx, 0, 1);

        Float dp;
        Float dx = distrib.Sample(u, &dp);
        EXPECT_LT(std::abs(cx - dx), 3e-3)
            << "Closed form = " << cx << ", distrib = " << dx;
        EXPECT_LT(std::abs(cp - dp), 3e-3)
            << "Closed form PDF = " << cp << ", distrib PDF = " << dp;
    }
}